

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall UnifiedRegex::CharSetInner::FreeSelf(CharSetInner *this,ArenaAllocator *allocator)

{
  CharSetNode *pCVar1;
  long lVar2;
  
  for (lVar2 = 1; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    pCVar1 = this->children[lVar2 + -1];
    if (pCVar1 != (CharSetNode *)0x0) {
      (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
      this->children[lVar2 + -1] = (CharSetNode *)0x0;
    }
  }
  Memory::
  DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::CharSetInner>
            (allocator,this);
  return;
}

Assistant:

void CharSetInner::FreeSelf(ArenaAllocator* allocator)
    {
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != 0)
            {
                children[i]->FreeSelf(allocator);
#if DBG
                children[i] = 0;
#endif
            }
        }
        Adelete(allocator, this);
    }